

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

SmallBuffer * helics::typeConvert(DataType type,bool val)

{
  string_view valname;
  SmallBuffer *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  reference this_00;
  byte in_DL;
  undefined4 in_ESI;
  SmallBuffer *in_RDI;
  json json;
  double vec;
  complex<double> cval;
  NamedPoint namePoint;
  bool *in_stack_fffffffffffffe68;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *in_stack_fffffffffffffe78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *other;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe80;
  NamedPoint *in_stack_fffffffffffffe88;
  NamedPoint *in_stack_fffffffffffffe90;
  complex<double> *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  double local_150;
  char *in_stack_fffffffffffffeb8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffec0;
  double local_120;
  undefined8 in_stack_fffffffffffffee8;
  DataType type_00;
  undefined8 local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined8 local_a0;
  complex<double> local_98 [6];
  complex<double> local_30;
  long local_20;
  undefined8 local_18;
  byte local_d;
  
  type_00 = (DataType)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_d = in_DL & 1;
  switch(in_ESI) {
  case 0:
  case 7:
  case 9:
  default:
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe88);
    break;
  case 1:
    local_110 = 0x3ff0000000000000;
    if (local_d == 0) {
      local_110 = 0;
    }
    local_18 = local_110;
    ValueConverter<double>::convert((double *)in_stack_fffffffffffffe88);
    break;
  case 2:
  case 8:
    local_20 = (long)(int)(uint)(local_d != 0);
    ValueConverter<long>::convert((long *)in_stack_fffffffffffffe88);
    break;
  case 3:
    local_120 = 1.0;
    if (local_d == 0) {
      local_120 = 0.0;
    }
    std::complex<double>::complex(&local_30,local_120,0.0);
    ValueConverter<std::complex<double>_>::convert((complex<double> *)in_stack_fffffffffffffe88);
    break;
  case 4:
    local_a0 = 0x3ff0000000000000;
    if (local_d == 0) {
      local_a0 = 0;
    }
    ValueConverter<double>::convert((double *)0x0,(size_t)in_stack_fffffffffffffe90);
    break;
  case 5:
    local_150 = 1.0;
    if (local_d == 0) {
      local_150 = 0.0;
    }
    std::complex<double>::complex(local_98,local_150,0.0);
    ValueConverter<std::complex<double>_>::convert
              (in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
    break;
  case 6:
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    valname._M_str = in_stack_fffffffffffffea0;
    valname._M_len = (size_t)in_stack_fffffffffffffe98;
    NamedPoint::NamedPoint(in_stack_fffffffffffffe90,valname,(double)in_stack_fffffffffffffe88);
    ValueConverter<helics::NamedPoint>::convert(in_stack_fffffffffffffe88);
    NamedPoint::~NamedPoint((NamedPoint *)0x43a970);
    break;
  case 0x1e:
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    this = (SmallBuffer *)typeNameStringRef_abi_cxx11_(type_00);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe88);
    u = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    other = &local_d0.field_2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffe80,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)other);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json(in_stack_fffffffffffffe70);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<bool_&,_bool,_0>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    this_00 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    this_01 = &local_d0;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=(this_00,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)other);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)this_01);
    fileops::generateJsonString((json *)other,SUB81((ulong)this_01 >> 0x38,0));
    SmallBuffer::SmallBuffer<std::__cxx11::string,void>(this,u);
    std::__cxx11::string::~string(this_01);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)this_01);
  }
  return in_RDI;
}

Assistant:

SmallBuffer typeConvert(DataType type, bool val)
{
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(val ? 1.0 : 0.0);
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(val ? 1 : 0);
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(
                std::complex<double>(val ? 1.0 : 0.0, 0.0));
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        case DataType::HELICS_BOOL:
        default:
            return ValueConverter<std::string_view>::convert(val ? "1" : "0");
        case DataType::HELICS_NAMED_POINT: {
            const NamedPoint namePoint{"value", val ? 1.0 : 0.0};
            return ValueConverter<NamedPoint>::convert(namePoint);
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            const std::complex<double> cval(val ? 1.0 : 0.0, 0.0);
            return ValueConverter<std::complex<double>>::convert(&cval, 1);
        }
        case DataType::HELICS_VECTOR: {
            auto vec = val ? 1.0 : 0.0;
            return ValueConverter<double>::convert(&vec, 1);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_BOOL);
            json["value"] = val;
            return fileops::generateJsonString(json);
        }
    }
}